

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O1

bool __thiscall
Network::Client::RingBufferStorage::Impl::load
          (Impl *this,uint16 packetID,uint8 **packetHead,uint32 *sizeHead,uint8 **packetTail,
          uint32 *sizeTail)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  PacketBookmark *pPVar5;
  
  bVar1 = this->packetsCount;
  if ((ulong)bVar1 == 0) {
    uVar4 = 0;
  }
  else {
    pPVar5 = this->packets;
    uVar4 = 0;
    do {
      if (*(uint16 *)pPVar5 == packetID) goto LAB_0011e81b;
      uVar4 = uVar4 + 1;
      pPVar5 = pPVar5 + 0xc;
    } while (bVar1 != uVar4);
    uVar4 = (ulong)bVar1;
  }
LAB_0011e81b:
  if ((byte)uVar4 < bVar1) {
    lVar2 = (ulong)(((uint)uVar4 & 0xff) << 2) * 3;
    *packetHead = this->buffer + *(uint *)(this->packets + lVar2 + 8);
    pPVar5 = this->packets;
    uVar3 = (this->sm1 - *(int *)(pPVar5 + lVar2 + 8)) + 1;
    if (*(uint *)(pPVar5 + lVar2 + 4) < uVar3) {
      uVar3 = *(uint *)(pPVar5 + lVar2 + 4);
    }
    *sizeHead = uVar3;
    *sizeTail = *(int *)(pPVar5 + lVar2 + 4) - uVar3;
    *packetTail = this->buffer;
  }
  return (byte)uVar4 < bVar1;
}

Assistant:

bool load(const uint16 packetID, const uint8 *& packetHead, uint32 & sizeHead, const uint8 *& packetTail,  uint32 & sizeTail)
        {
            // Look for the packet
            uint8 i = findID(packetID);
            if (i == packetsCount) return false;

            // Check if the packet is split
            packetHead = buffer + packets[i].pos;
            sizeHead = min(packets[i].size, (sm1 - packets[i].pos + 1));
            sizeTail = packets[i].size - sizeHead;
            packetTail = buffer;
            return true;
        }